

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lower.cpp
# Opt level: O1

Instr * Lowerer::HoistIndirOffset(Instr *instr,IndirOpnd *indirOpnd,RegNum regNum)

{
  int offset;
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  Instr *pIVar4;
  IntConstOpnd *src;
  StackSym *sym;
  RegOpnd *indexOpnd;
  
  offset = indirOpnd->m_offset;
  if (indirOpnd->m_indexOpnd == (RegOpnd *)0x0) {
    src = IR::IntConstOpnd::New((long)offset,TyInt32,instr->m_func,false);
    sym = StackSym::New(TyInt64,instr->m_func);
    indexOpnd = IR::RegOpnd::New(sym,regNum,TyInt64,instr->m_func);
    indirOpnd->m_offset = 0;
    (indirOpnd->super_Opnd).field_0xe = 0;
    IR::IndirOpnd::SetIndexOpnd(indirOpnd,indexOpnd);
    pIVar4 = InsertMove(&indexOpnd->super_Opnd,&src->super_Opnd,instr,true);
    StackSym::SetIsIntConst(indexOpnd->m_sym,(long)offset);
    return pIVar4;
  }
  if (indirOpnd->m_baseOpnd == (RegOpnd *)0x0) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar3 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/Lower.cpp"
                       ,0x3cb5,"(indirOpnd->GetBaseOpnd())","indirOpnd->GetBaseOpnd()");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar3 = 0;
  }
  pIVar4 = HoistIndirOffsetAsAdd(instr,indirOpnd,&indirOpnd->m_baseOpnd->super_Opnd,offset,regNum);
  return pIVar4;
}

Assistant:

IR::Instr *Lowerer::HoistIndirOffset(IR::Instr* instr, IR::IndirOpnd *indirOpnd, RegNum regNum)
{
    int32 offset = indirOpnd->GetOffset();
    if (indirOpnd->GetIndexOpnd())
    {
        Assert(indirOpnd->GetBaseOpnd());
        return Lowerer::HoistIndirOffsetAsAdd(instr, indirOpnd, indirOpnd->GetBaseOpnd(), offset, regNum);
    }
    IR::IntConstOpnd *offsetOpnd = IR::IntConstOpnd::New(offset, TyInt32, instr->m_func);
    IR::RegOpnd *indexOpnd = IR::RegOpnd::New(StackSym::New(TyMachReg, instr->m_func), regNum, TyMachReg, instr->m_func);

#if defined(DBG) && defined(_M_ARM)
    if (regNum == SCRATCH_REG)
    {
        AssertMsg(indirOpnd->GetBaseOpnd()->GetReg()!= SCRATCH_REG, "Why both are SCRATCH_REG");
        if (instr->GetSrc1() && instr->GetSrc1()->IsRegOpnd())
        {
            Assert(instr->GetSrc1()->AsRegOpnd()->GetReg() != SCRATCH_REG);
        }
        if (instr->GetSrc2() && instr->GetSrc2()->IsRegOpnd())
        {
            Assert(instr->GetSrc2()->AsRegOpnd()->GetReg() != SCRATCH_REG);
        }
        if (instr->GetDst() && instr->GetDst()->IsRegOpnd())
        {
            Assert(instr->GetDst()->AsRegOpnd()->GetReg() != SCRATCH_REG);
        }
    }
#endif
    // Clear the offset and add a new reg as the index.
    indirOpnd->SetOffset(0);
    indirOpnd->SetIndexOpnd(indexOpnd);

    IR::Instr *instrAssign = Lowerer::InsertMove(indexOpnd, offsetOpnd, instr);
    indexOpnd->m_sym->SetIsIntConst(offset);
    return instrAssign;
}